

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O0

QSizeF __thiscall QItemDelegatePrivate::doTextLayout(QItemDelegatePrivate *this,int lineWidth)

{
  QSizeF QVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  QTextEngine *extraout_RDX;
  int in_ESI;
  long in_FS_OFFSET;
  double dVar5;
  qreal height;
  QTextLine line;
  qreal widthUsed;
  qreal local_60;
  double local_48;
  QPointF local_40;
  undefined1 *local_30;
  QTextEngine *local_28;
  double local_20;
  QSizeF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = 0.0;
  local_20 = 0.0;
  QTextLayout::beginLayout();
  while( true ) {
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
    iVar3 = QTextLayout::createLine();
    local_30 = (undefined1 *)CONCAT44(local_30._4_4_,iVar3);
    local_28 = extraout_RDX;
    bVar2 = QTextLine::isValid((QTextLine *)&local_30);
    if (!bVar2) break;
    QTextLine::setLineWidth((double)in_ESI);
    QPointF::QPointF(&local_40,0.0,local_60);
    QTextLine::setPosition((QPointF *)&local_30);
    dVar5 = (double)QTextLine::height();
    local_60 = dVar5 + local_60;
    local_48 = (double)QTextLine::naturalTextWidth();
    pdVar4 = qMax<double>(&local_20,&local_48);
    local_20 = *pdVar4;
  }
  QTextLayout::endLayout();
  QSizeF::QSizeF(&local_18,local_20,local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1.ht = local_18.ht;
    QVar1.wd = local_18.wd;
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QSizeF QItemDelegatePrivate::doTextLayout(int lineWidth) const
{
    qreal height = 0;
    qreal widthUsed = 0;
    textLayout.beginLayout();
    while (true) {
        QTextLine line = textLayout.createLine();
        if (!line.isValid())
            break;
        line.setLineWidth(lineWidth);
        line.setPosition(QPointF(0, height));
        height += line.height();
        widthUsed = qMax(widthUsed, line.naturalTextWidth());
    }
    textLayout.endLayout();
    return QSizeF(widthUsed, height);
}